

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O1

bool google::protobuf::internal::AllAreInitialized<google::protobuf::FileDescriptorProto>
               (RepeatedPtrField<google::protobuf::FileDescriptorProto> *t)

{
  int iVar1;
  char cVar2;
  MessageLite *pMVar3;
  int iVar4;
  
  iVar1 = (t->super_RepeatedPtrFieldBase).current_size_;
  do {
    iVar4 = iVar1;
    if (iVar4 < 1) break;
    pMVar3 = (MessageLite *)
             RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                       (&t->super_RepeatedPtrFieldBase,iVar4 + -1);
    cVar2 = google::protobuf::FileDescriptorProto::IsInitializedImpl(pMVar3);
    iVar1 = iVar4 + -1;
  } while (cVar2 != '\0');
  return iVar4 < 1;
}

Assistant:

bool AllAreInitialized(const RepeatedPtrField<Msg>& t) {
  for (int i = t.size(); --i >= 0;) {
    if (!t.Get(i).IsInitialized()) return false;
  }
  return true;
}